

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O1

size_t __thiscall proto3::MapOutWireFormat_Map4Entry::ByteSizeLong(MapOutWireFormat_Map4Entry *this)

{
  long lVar1;
  int iVar2;
  anon_union_24_1_493b367e_for_MapOutWireFormat_Map4Entry_3 aVar3;
  uint uVar4;
  size_t sVar5;
  
  aVar3 = this->field_0;
  if (((undefined1  [24])aVar3 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar5 = 0;
  }
  else {
    if ((((undefined1  [24])aVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) ||
       (lVar1 = *(long *)(((ulong)(this->field_0)._impl_.value_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc) + 8), lVar1 == 0)) {
      sVar5 = 0;
    }
    else {
      uVar4 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((((undefined1  [24])aVar3 & (undefined1  [24])0x2) != (undefined1  [24])0x0) &&
       ((this->field_0)._impl_.key_ != false)) {
      sVar5 = sVar5 + 2;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}